

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xts.cc
# Opt level: O1

int aes_xts_ctrl(EVP_CIPHER_CTX *c,int type,int arg,void *ptr)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = c->cipher_data;
  if (type == 0) {
    *(undefined8 *)((long)pvVar1 + 0x1f0) = 0;
    *(undefined8 *)((long)pvVar1 + 0x1f8) = 0;
  }
  else {
    if (type != 8) {
      return -1;
    }
    lVar2 = *(long *)((long)ptr + 0x10);
    if (*(void **)((long)pvVar1 + 0x1f0) != (void *)0x0) {
      if (*(void **)((long)pvVar1 + 0x1f0) != pvVar1) {
        return 0;
      }
      *(long *)(lVar2 + 0x1f0) = lVar2;
    }
    if (*(long *)((long)pvVar1 + 0x1f8) != 0) {
      if (*(long *)((long)pvVar1 + 0x1f8) != (long)pvVar1 + 0xf8) {
        return 0;
      }
      *(long *)(lVar2 + 0x1f8) = lVar2 + 0xf8;
      return 1;
    }
  }
  return 1;
}

Assistant:

static int aes_xts_ctrl(EVP_CIPHER_CTX *c, int type, int arg, void *ptr) {
  EVP_AES_XTS_CTX *xctx = reinterpret_cast<EVP_AES_XTS_CTX *>(c->cipher_data);
  if (type == EVP_CTRL_COPY) {
    EVP_CIPHER_CTX *out = reinterpret_cast<EVP_CIPHER_CTX *>(ptr);
    EVP_AES_XTS_CTX *xctx_out =
        reinterpret_cast<EVP_AES_XTS_CTX *>(out->cipher_data);
    if (xctx->xts.key1) {
      if (xctx->xts.key1 != &xctx->ks1.ks) {
        return 0;
      }
      xctx_out->xts.key1 = &xctx_out->ks1.ks;
    }
    if (xctx->xts.key2) {
      if (xctx->xts.key2 != &xctx->ks2.ks) {
        return 0;
      }
      xctx_out->xts.key2 = &xctx_out->ks2.ks;
    }
    return 1;
  } else if (type != EVP_CTRL_INIT) {
    return -1;
  }
  // key1 and key2 are used as an indicator both key and IV are set
  xctx->xts.key1 = NULL;
  xctx->xts.key2 = NULL;
  return 1;
}